

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void LzmaEncProps_Normalize(CLzmaEncProps *p)

{
  byte bVar1;
  int iVar2;
  UInt32 local_14;
  uint i;
  int level;
  CLzmaEncProps *p_local;
  
  level = p->level;
  if (level < 0) {
    level = 5;
  }
  p->level = level;
  if (p->dictSize == 0) {
    if (level < 6) {
      local_14 = 1 << ((char)(level << 1) + 0xeU & 0x1f);
    }
    else {
      local_14 = 0x4000000;
      if (level == 6) {
        local_14 = 0x2000000;
      }
    }
    p->dictSize = local_14;
  }
  if (p->reduceSize < (ulong)p->dictSize) {
    for (i = 0xb; i < 0x1f; i = i + 1) {
      bVar1 = (byte)i;
      if ((uint)p->reduceSize <= (uint)(2 << (bVar1 & 0x1f))) {
        p->dictSize = 2 << (bVar1 & 0x1f);
        break;
      }
      if ((uint)p->reduceSize <= (uint)(3 << (bVar1 & 0x1f))) {
        p->dictSize = 3 << (bVar1 & 0x1f);
        break;
      }
    }
  }
  if (p->lc < 0) {
    p->lc = 3;
  }
  if (p->lp < 0) {
    p->lp = 0;
  }
  if (p->pb < 0) {
    p->pb = 2;
  }
  if (p->algo < 0) {
    p->algo = (uint)(4 < level);
  }
  if (p->fb < 0) {
    iVar2 = 0x40;
    if (level < 7) {
      iVar2 = 0x20;
    }
    p->fb = iVar2;
  }
  if (p->btMode < 0) {
    p->btMode = (uint)(p->algo != 0);
  }
  if (p->numHashBytes < 0) {
    p->numHashBytes = 4;
  }
  if (p->mc == 0) {
    p->mc = (p->fb >> 1) + 0x10 >> (p->btMode == 0);
  }
  if (p->numThreads < 0) {
    p->numThreads = 1;
  }
  return;
}

Assistant:

void LzmaEncProps_Normalize(CLzmaEncProps *p)
{
  int level = p->level;
  if (level < 0) level = 5;
  p->level = level;
  
  if (p->dictSize == 0) p->dictSize = (level <= 5 ? (1 << (level * 2 + 14)) : (level == 6 ? (1 << 25) : (1 << 26)));
  if (p->dictSize > p->reduceSize)
  {
    unsigned i;
    for (i = 11; i <= 30; i++)
    {
      if ((UInt32)p->reduceSize <= ((UInt32)2 << i)) { p->dictSize = ((UInt32)2 << i); break; }
      if ((UInt32)p->reduceSize <= ((UInt32)3 << i)) { p->dictSize = ((UInt32)3 << i); break; }
    }
  }

  if (p->lc < 0) p->lc = 3;
  if (p->lp < 0) p->lp = 0;
  if (p->pb < 0) p->pb = 2;

  if (p->algo < 0) p->algo = (level < 5 ? 0 : 1);
  if (p->fb < 0) p->fb = (level < 7 ? 32 : 64);
  if (p->btMode < 0) p->btMode = (p->algo == 0 ? 0 : 1);
  if (p->numHashBytes < 0) p->numHashBytes = 4;
  if (p->mc == 0) p->mc = (16 + (p->fb >> 1)) >> (p->btMode ? 0 : 1);
  
  if (p->numThreads < 0)
    p->numThreads =
      #ifndef _7ZIP_ST
      ((p->btMode && p->algo) ? 2 : 1);
      #else
      1;
      #endif
}